

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

int txt_np(char *dest,int sd)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  distribution *s;
  byte *pbVar5;
  int iVar6;
  char syntax [13];
  char local_3d [13];
  
  pick_str(&np,sd,local_3d);
  pbVar3 = (byte *)strtok(local_3d," ");
  if (pbVar3 == (byte *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    do {
      bVar1 = *pbVar3;
      if (bVar1 < 0x4a) {
        if (bVar1 == 0x41) {
          s = &articles;
        }
        else {
          s = (distribution *)0x0;
          if (bVar1 == 0x44) {
            s = &adverbs;
          }
        }
      }
      else if (bVar1 == 0x4a) {
        s = &adjectives;
      }
      else {
        s = (distribution *)0x0;
        if (bVar1 == 0x4e) {
          s = &nouns;
        }
      }
      iVar2 = pick_str(s,sd,dest);
      sVar4 = strlen(s->list[iVar2].text);
      pbVar5 = (byte *)dest + (int)sVar4;
      iVar6 = iVar6 + (int)sVar4;
      if (pbVar3[1] != 0) {
        *pbVar5 = pbVar3[1];
        pbVar5 = pbVar5 + 1;
        iVar6 = iVar6 + 1;
      }
      *pbVar5 = 0x20;
      dest = (char *)(pbVar5 + 1);
      iVar6 = iVar6 + 1;
      pbVar3 = (byte *)strtok((char *)0x0," ");
    } while (pbVar3 != (byte *)0x0);
  }
  return iVar6;
}

Assistant:

static int
txt_np(char *dest, int sd) 
{
	char syntax[MAX_GRAMMAR_LEN + 1],
		*cptr,
		*parse_target;
	distribution *src;
	int i,
		res = 0;

	
	pick_str(&np, sd, &syntax[0]);
	parse_target = syntax;
	while ((cptr = strtok(parse_target, " ")) != NULL)
	{
		src = NULL;
		switch(*cptr)
		{
		case 'A':
			src = &articles;
			break;
		case 'J':
			src = &adjectives;
			break;
		case 'D':
			src = &adverbs;
			break;
		case 'N': 
			src = &nouns;
			break;
		}	/* end of POS switch statement */
		i = pick_str(src, sd, dest);
		i = strlen(DIST_MEMBER(src, i));
		dest += i;
		res += i;
		if (*(++cptr))	/* miscelaneous fillagree, like punctuation */
		{
			*dest = *cptr;
			dest += 1;
			res += 1;
		}
		*dest = ' ';
		dest++;
		res++;
		parse_target = NULL;
	}	/* end of while loop */

	return(res);
}